

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void gai_SetStrideWithSkip
               (Integer ndim,Integer size,Integer *ld,Integer *ldrem,int *stride_rem,int *stride_loc
               ,Integer *skip)

{
  int iVar1;
  long lVar2;
  
  *stride_loc = (int)size;
  *stride_rem = (int)size;
  if (0 < ndim) {
    lVar2 = 0;
    do {
      iVar1 = stride_rem[lVar2];
      stride_rem[lVar2] = (int)skip[lVar2] * iVar1;
      stride_rem[lVar2 + 1] = iVar1 * (int)ldrem[lVar2];
      stride_loc[lVar2 + 1] = stride_loc[lVar2] * (int)ld[lVar2];
      lVar2 = lVar2 + 1;
    } while (ndim != lVar2);
  }
  return;
}

Assistant:

void gai_SetStrideWithSkip(Integer ndim, Integer size, Integer *ld,
                          Integer *ldrem, int *stride_rem,
                          int *stride_loc, Integer *skip)
{
#if 1
  int i;
  stride_rem[0] = stride_loc[0] = (int)size;
  for (i=0; i<ndim; i++) {
    stride_rem[i+1] = stride_rem[i];
    stride_rem[i] *= skip[i];
    stride_rem[i+1] *= (int)ldrem[i];
    stride_loc[i+1] = stride_loc[i];
    stride_loc[i+1] *= (int)ld[i];
  }
#else
  int i, istride;
  stride_rem[0] = stride_loc[0] = (int)size;
  istride = 0;
  for (i=0; i<ndim; i++) {
    if (skip[i] > 1) {
      stride_rem[istride] *= (int)skip[i];
      stride_rem[istride+1] = stride_rem[istride]/((int)skip[i]);
      stride_loc[istride+1] = stride_loc[istride];
      istride++;
      if (i<ndim-1) {
        stride_rem[istride] *= (int)ldrem[i];
        stride_rem[istride+1] = stride_rem[istride];
        stride_loc[istride] *= (int)ld[i];
        stride_loc[istride+1] = stride_loc[istride];
      }
    } else {
      if (i<ndim-1) {
        stride_rem[istride] *= (int)ldrem[i];
        stride_rem[istride+1] = stride_rem[istride];
        stride_loc[istride] *= ld[i];
        stride_loc[istride+1] = stride_loc[istride];
      }
    }
    istride++;
  }
#endif
}